

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdgen.c
# Opt level: O3

_Bool move(char *from,char *to)

{
  int iVar1;
  _Bool _Var2;
  
  iVar1 = rename(from,to);
  _Var2 = true;
  if (iVar1 != 0) {
    remove(to);
    iVar1 = rename(from,to);
    if (iVar1 != 0) {
      perror("puttygen: cannot move new file on to old one");
      _Var2 = false;
    }
  }
  return _Var2;
}

Assistant:

static bool move(char *from, char *to)
{
    int ret;

    ret = rename(from, to);
    if (ret) {
        /*
         * This OS may require us to remove the original file first.
         */
        remove(to);
        ret = rename(from, to);
    }
    if (ret) {
        perror("puttygen: cannot move new file on to old one");
        return false;
    }
    return true;
}